

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t icu_63::TimeZoneFormat::parseAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,UChar sep,OffsetFields minFields,
                  OffsetFields maxFields)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  UChar UVar7;
  int iVar8;
  char16_t *pcVar9;
  long lVar10;
  uint uVar11;
  int local_50 [4];
  uint local_40 [4];
  int32_t fieldLen [3];
  int32_t fieldVal [3];
  
  uVar2 = pos->index;
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_50[0] = 0;
  local_50[1] = -1;
  local_50[2] = -1;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (-1 < (int)maxFields && (int)uVar2 < (int)uVar5) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar9 = (text->fUnion).fFields.fArray;
    }
    else {
      pcVar9 = (char16_t *)((long)&text->fUnion + 2);
    }
    iVar6 = 0;
    uVar11 = uVar2;
    lVar10 = (long)(int)uVar2;
    do {
      UVar7 = L'\xffff';
      if (uVar11 < uVar5) {
        UVar7 = pcVar9[lVar10];
      }
      if (UVar7 == sep) {
        if (iVar6 == 0) {
          if (local_50[0] != 0) goto LAB_001feafe;
          bVar4 = true;
          iVar6 = 0;
        }
        else {
          bVar4 = true;
          if (local_50[iVar6] == -1) {
            local_50[iVar6] = 0;
LAB_001feafe:
            bVar4 = false;
          }
        }
      }
      else {
        iVar8 = local_50[iVar6];
        bVar4 = true;
        if (iVar8 != -1) {
          iVar3 = (ushort)UVar7 - 0x30;
          if (9 < (ushort)((ushort)UVar7 - 0x30)) {
            iVar3 = -1;
          }
          if (-1 < iVar3) {
            local_40[iVar6] = iVar3 + local_40[iVar6] * 10;
            local_50[iVar6] = iVar8 + 1;
            iVar6 = iVar6 + (uint)(0 < iVar8);
            bVar4 = false;
          }
        }
      }
    } while (((!bVar4) && (lVar10 + 1 < (long)(int)uVar5)) &&
            (uVar11 = uVar11 + 1, lVar10 = lVar10 + 1, iVar6 <= (int)maxFields));
  }
  if (local_50[0] == 0) {
    iVar8 = -1;
    iVar6 = 0;
    local_50[0] = 0;
  }
  else if ((int)local_40[0] < 0x18) {
    iVar6 = local_40[0] * 3600000;
    if ((int)local_40[1] < 0x3c && local_50[1] == 2) {
      iVar6 = iVar6 + local_40[1] * 60000;
      if ((int)local_40[2] < 0x3c && local_50[2] == 2) {
        iVar6 = iVar6 + local_40[2] * 1000;
        local_50[0] = local_50[0] + 6;
        iVar8 = 2;
      }
      else {
        local_50[0] = local_50[0] + 3;
        iVar8 = 1;
      }
    }
    else {
      iVar8 = 0;
    }
  }
  else {
    iVar6 = (local_40[0] / 10) * 3600000;
    iVar8 = 0;
    local_50[0] = 1;
  }
  if (iVar8 < (int)minFields) {
    pos->errorIndex = uVar2;
    iVar6 = 0;
  }
  else {
    pos->index = local_50[0] + uVar2;
  }
  return iVar6;
}

Assistant:

int32_t
TimeZoneFormat::parseAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, UChar sep, OffsetFields minFields, OffsetFields maxFields) {
    int32_t start = pos.getIndex();
    int32_t fieldVal[] = {0, 0, 0};
    int32_t fieldLen[] = {0, -1, -1};
    for (int32_t idx = start, fieldIdx = 0; idx < text.length() && fieldIdx <= maxFields; idx++) {
        UChar c = text.charAt(idx);
        if (c == sep) {
            if (fieldIdx == 0) {
                if (fieldLen[0] == 0) {
                    // no hours field
                    break;
                }
                // 1 digit hour, move to next field
            } else {
                if (fieldLen[fieldIdx] != -1) {
                    // premature minute or seconds field
                    break;
                }
                fieldLen[fieldIdx] = 0;
            }
            continue;
        } else if (fieldLen[fieldIdx] == -1) {
            // no separator after 2 digit field
            break;
        }
        int32_t digit = DIGIT_VAL(c);
        if (digit < 0) {
            // not a digit
            break;
        }
        fieldVal[fieldIdx] = fieldVal[fieldIdx] * 10 + digit;
        fieldLen[fieldIdx]++;
        if (fieldLen[fieldIdx] >= 2) {
            // parsed 2 digits, move to next field
            fieldIdx++;
        }
    }

    int32_t offset = 0;
    int32_t parsedLen = 0;
    int32_t parsedFields = -1;
    do {
        // hour
        if (fieldLen[0] == 0) {
            break;
        }
        if (fieldVal[0] > MAX_OFFSET_HOUR) {
            offset = (fieldVal[0] / 10) * MILLIS_PER_HOUR;
            parsedFields = FIELDS_H;
            parsedLen = 1;
            break;
        }
        offset = fieldVal[0] * MILLIS_PER_HOUR;
        parsedLen = fieldLen[0];
        parsedFields = FIELDS_H;

        // minute
        if (fieldLen[1] != 2 || fieldVal[1] > MAX_OFFSET_MINUTE) {
            break;
        }
        offset += fieldVal[1] * MILLIS_PER_MINUTE;
        parsedLen += (1 + fieldLen[1]);
        parsedFields = FIELDS_HM;

        // second
        if (fieldLen[2] != 2 || fieldVal[2] > MAX_OFFSET_SECOND) {
            break;
        }
        offset += fieldVal[2] * MILLIS_PER_SECOND;
        parsedLen += (1 + fieldLen[2]);
        parsedFields = FIELDS_HMS;
    } while (false);

    if (parsedFields < minFields) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(start + parsedLen);
    return offset;
}